

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_cpp_generator.cc
# Opt level: O2

void __thiscall
t_cpp_generator::generate_service_async_skeleton(t_cpp_generator *this,t_service *tservice)

{
  int *piVar1;
  t_function *ptVar2;
  t_type *type;
  int iVar3;
  undefined4 extraout_var;
  ostream *poVar4;
  int __oflag;
  t_cpp_generator *this_00;
  char *pcVar5;
  pointer pptVar6;
  string local_518;
  string target;
  string svcname;
  string local_4b8;
  vector<t_function_*,_std::allocator<t_function_*>_> functions;
  t_field returnfield;
  string local_3d0;
  string ns;
  string local_390;
  string local_370;
  string local_350;
  string local_330;
  string local_310;
  string local_2f0;
  string local_2d0;
  string f_skeleton_name;
  string local_290;
  string local_270;
  string local_250;
  string local_230;
  ofstream_with_content_based_conditional_update f_skeleton;
  string local_70;
  string local_50;
  
  iVar3 = (*(tservice->super_t_type).super_t_doc._vptr_t_doc[3])(tservice);
  std::__cxx11::string::string((string *)&svcname,(string *)CONCAT44(extraout_var,iVar3));
  (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x1b])(&returnfield,this);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&f_skeleton,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&returnfield,
                 &svcname);
  std::operator+(&f_skeleton_name,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&f_skeleton,
                 "_async_server.skeleton.cpp");
  std::__cxx11::string::~string((string *)&f_skeleton);
  std::__cxx11::string::~string((string *)&returnfield);
  this_00 = (t_cpp_generator *)(tservice->super_t_type).program_;
  std::__cxx11::string::string((string *)&local_2f0,"cpp",(allocator *)&f_skeleton);
  t_program::get_namespace(&local_2d0,(t_program *)this_00,&local_2f0);
  namespace_prefix(&ns,this_00,&local_2d0);
  std::__cxx11::string::~string((string *)&local_2d0);
  std::__cxx11::string::~string((string *)&local_2f0);
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::
  template_ofstream_with_content_based_conditional_update(&f_skeleton);
  std::__cxx11::string::string
            ((string *)&returnfield,f_skeleton_name._M_dataplus._M_p,(allocator *)&target);
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::open
            (&f_skeleton,(char *)&returnfield,__oflag);
  std::__cxx11::string::~string((string *)&returnfield);
  poVar4 = std::operator<<((ostream *)&f_skeleton,
                           "// This autogenerated skeleton file illustrates one way to adapt a synchronous"
                          );
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  poVar4 = std::operator<<(poVar4,
                           "// interface into an asynchronous interface. You should copy it to another"
                          );
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  poVar4 = std::operator<<(poVar4,
                           "// filename to avoid overwriting it and rewrite as asynchronous any functions"
                          );
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  poVar4 = std::operator<<(poVar4,"// that would otherwise introduce unwanted latency.");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  poVar4 = std::operator<<(poVar4,"#include \"");
  get_include_prefix_abi_cxx11_
            ((string *)&returnfield,this,(this->super_t_oop_generator).super_t_generator.program_);
  poVar4 = std::operator<<(poVar4,(string *)&returnfield);
  poVar4 = std::operator<<(poVar4,(string *)&svcname);
  poVar4 = std::operator<<(poVar4,".h\"");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  poVar4 = std::operator<<(poVar4,"#include <thrift/protocol/TBinaryProtocol.h>");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  poVar4 = std::operator<<(poVar4,"#include <thrift/async/TAsyncProtocolProcessor.h>");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  poVar4 = std::operator<<(poVar4,"#include <thrift/async/TEvhttpServer.h>");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  poVar4 = std::operator<<(poVar4,"#include <event.h>");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  poVar4 = std::operator<<(poVar4,"#include <evhttp.h>");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  poVar4 = std::operator<<(poVar4,"using namespace ::apache::thrift;");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  poVar4 = std::operator<<(poVar4,"using namespace ::apache::thrift::protocol;");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  poVar4 = std::operator<<(poVar4,"using namespace ::apache::thrift::transport;");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  poVar4 = std::operator<<(poVar4,"using namespace ::apache::thrift::async;");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&returnfield);
  if (ns._M_string_length != 0) {
    iVar3 = std::__cxx11::string::compare((char *)&ns);
    if (iVar3 != 0) {
      poVar4 = std::operator<<((ostream *)&f_skeleton,"using namespace ");
      std::__cxx11::string::string((string *)&returnfield,(string *)&ns,0,ns._M_string_length - 2);
      poVar4 = std::operator<<(poVar4,(string *)&returnfield);
      poVar4 = std::operator<<(poVar4,";");
      poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&returnfield);
    }
  }
  poVar4 = std::operator<<((ostream *)&f_skeleton,"class ");
  poVar4 = std::operator<<(poVar4,(string *)&svcname);
  poVar4 = std::operator<<(poVar4,"Handler : virtual public ");
  poVar4 = std::operator<<(poVar4,(string *)&svcname);
  poVar4 = std::operator<<(poVar4,"If {");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  poVar4 = std::operator<<(poVar4," public:");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  t_generator::indent_abi_cxx11_((string *)&returnfield,(t_generator *)this);
  poVar4 = std::operator<<((ostream *)&f_skeleton,(string *)&returnfield);
  poVar4 = std::operator<<(poVar4,(string *)&svcname);
  poVar4 = std::operator<<(poVar4,"Handler() {");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&target,(t_generator *)this);
  poVar4 = std::operator<<(poVar4,(string *)&target);
  poVar4 = std::operator<<(poVar4,"  // Your initialization goes here");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_518,(t_generator *)this);
  poVar4 = std::operator<<(poVar4,(string *)&local_518);
  poVar4 = std::operator<<(poVar4,"}");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_518);
  std::__cxx11::string::~string((string *)&target);
  std::__cxx11::string::~string((string *)&returnfield);
  std::vector<t_function_*,_std::allocator<t_function_*>_>::vector(&functions,&tservice->functions_)
  ;
  for (pptVar6 = functions.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      pptVar6 !=
      functions.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
      super__Vector_impl_data._M_finish; pptVar6 = pptVar6 + 1) {
    (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x23])
              (this,&f_skeleton,*pptVar6);
    t_generator::indent_abi_cxx11_((string *)&returnfield,(t_generator *)this);
    poVar4 = std::operator<<((ostream *)&f_skeleton,(string *)&returnfield);
    ptVar2 = *pptVar6;
    std::__cxx11::string::string((string *)&local_310,"",(allocator *)&local_370);
    std::__cxx11::string::string((string *)&local_230,"",(allocator *)&local_390);
    function_signature(&target,this,ptVar2,&local_310,&local_230,true);
    poVar4 = std::operator<<(poVar4,(string *)&target);
    poVar4 = std::operator<<(poVar4," {");
    poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_518,(t_generator *)this);
    poVar4 = std::operator<<(poVar4,(string *)&local_518);
    poVar4 = std::operator<<(poVar4,"  // Your implementation goes here");
    poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_4b8,(t_generator *)this);
    poVar4 = std::operator<<(poVar4,(string *)&local_4b8);
    poVar4 = std::operator<<(poVar4,"  printf(\"");
    poVar4 = std::operator<<(poVar4,(string *)&(*pptVar6)->name_);
    poVar4 = std::operator<<(poVar4,"\\n\");");
    poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_3d0,(t_generator *)this);
    poVar4 = std::operator<<(poVar4,(string *)&local_3d0);
    poVar4 = std::operator<<(poVar4,"}");
    poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_3d0);
    std::__cxx11::string::~string((string *)&local_4b8);
    std::__cxx11::string::~string((string *)&local_518);
    std::__cxx11::string::~string((string *)&target);
    std::__cxx11::string::~string((string *)&local_230);
    std::__cxx11::string::~string((string *)&local_310);
    std::__cxx11::string::~string((string *)&returnfield);
  }
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -1;
  poVar4 = std::operator<<((ostream *)&f_skeleton,"};");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  poVar4 = std::operator<<((ostream *)&f_skeleton,"class ");
  poVar4 = std::operator<<(poVar4,(string *)&svcname);
  poVar4 = std::operator<<(poVar4,"AsyncHandler : ");
  poVar4 = std::operator<<(poVar4,"public ");
  poVar4 = std::operator<<(poVar4,(string *)&svcname);
  poVar4 = std::operator<<(poVar4,"CobSvIf {");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  poVar4 = std::operator<<(poVar4," public:");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  t_generator::indent_abi_cxx11_((string *)&returnfield,(t_generator *)this);
  poVar4 = std::operator<<((ostream *)&f_skeleton,(string *)&returnfield);
  poVar4 = std::operator<<(poVar4,(string *)&svcname);
  poVar4 = std::operator<<(poVar4,"AsyncHandler() {");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&target,(t_generator *)this);
  poVar4 = std::operator<<(poVar4,(string *)&target);
  poVar4 = std::operator<<(poVar4,"  syncHandler_ = std::unique_ptr<");
  poVar4 = std::operator<<(poVar4,(string *)&svcname);
  poVar4 = std::operator<<(poVar4,"Handler>(new ");
  poVar4 = std::operator<<(poVar4,(string *)&svcname);
  poVar4 = std::operator<<(poVar4,"Handler);");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_518,(t_generator *)this);
  poVar4 = std::operator<<(poVar4,(string *)&local_518);
  poVar4 = std::operator<<(poVar4,"  // Your initialization goes here");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_4b8,(t_generator *)this);
  poVar4 = std::operator<<(poVar4,(string *)&local_4b8);
  poVar4 = std::operator<<(poVar4,"}");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_4b8);
  std::__cxx11::string::~string((string *)&local_518);
  std::__cxx11::string::~string((string *)&target);
  std::__cxx11::string::~string((string *)&returnfield);
  t_generator::indent_abi_cxx11_((string *)&returnfield,(t_generator *)this);
  poVar4 = std::operator<<((ostream *)&f_skeleton,(string *)&returnfield);
  poVar4 = std::operator<<(poVar4,"virtual ~");
  poVar4 = std::operator<<(poVar4,(string *)
                                  &(this->super_t_oop_generator).super_t_generator.service_name_);
  poVar4 = std::operator<<(poVar4,"AsyncHandler();");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&returnfield);
  for (pptVar6 = functions.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      pptVar6 !=
      functions.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
      super__Vector_impl_data._M_finish; pptVar6 = pptVar6 + 1) {
    poVar4 = std::operator<<((ostream *)&f_skeleton,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_((string *)&returnfield,(t_generator *)this);
    poVar4 = std::operator<<(poVar4,(string *)&returnfield);
    ptVar2 = *pptVar6;
    std::__cxx11::string::string((string *)&local_330,"CobSv",(allocator *)&local_518);
    std::__cxx11::string::string((string *)&local_250,"",(allocator *)&local_4b8);
    function_signature(&target,this,ptVar2,&local_330,&local_250,true);
    poVar4 = std::operator<<(poVar4,(string *)&target);
    poVar4 = std::operator<<(poVar4," {");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&target);
    std::__cxx11::string::~string((string *)&local_250);
    std::__cxx11::string::~string((string *)&local_330);
    std::__cxx11::string::~string((string *)&returnfield);
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + 1;
    type = (*pptVar6)->returntype_;
    std::__cxx11::string::string((string *)&local_50,"_return",(allocator *)&target);
    t_field::t_field(&returnfield,type,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    iVar3 = (*(type->super_t_doc)._vptr_t_doc[4])(type);
    pcVar5 = "_return";
    if ((char)iVar3 != '\0') {
      pcVar5 = "";
    }
    std::__cxx11::string::string((string *)&target,pcVar5,(allocator *)&local_518);
    iVar3 = (*(type->super_t_doc)._vptr_t_doc[4])(type);
    if ((char)iVar3 == '\0') {
      t_generator::indent_abi_cxx11_(&local_518,(t_generator *)this);
      poVar4 = std::operator<<((ostream *)&f_skeleton,(string *)&local_518);
      declare_field_abi_cxx11_(&local_4b8,this,&returnfield,true,false,false,false);
      poVar4 = std::operator<<(poVar4,(string *)&local_4b8);
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_4b8);
      std::__cxx11::string::~string((string *)&local_518);
    }
    ptVar2 = *pptVar6;
    std::__cxx11::string::string((string *)&local_270,(string *)&target);
    std::__cxx11::string::string((string *)&local_290,"syncHandler_",(allocator *)&local_518);
    std::__cxx11::string::string((string *)&local_70,"",(allocator *)&local_4b8);
    generate_function_call(this,(ostream *)&f_skeleton,ptVar2,&local_270,&local_290,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_290);
    std::__cxx11::string::~string((string *)&local_270);
    t_generator::indent_abi_cxx11_(&local_518,(t_generator *)this);
    poVar4 = std::operator<<((ostream *)&f_skeleton,(string *)&local_518);
    poVar4 = std::operator<<(poVar4,"return cob(");
    poVar4 = std::operator<<(poVar4,(string *)&target);
    poVar4 = std::operator<<(poVar4,");");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_518);
    t_oop_generator::scope_down(&this->super_t_oop_generator,(ostream *)&f_skeleton);
    std::__cxx11::string::~string((string *)&target);
    t_field::~t_field(&returnfield);
  }
  poVar4 = std::operator<<((ostream *)&f_skeleton,(string *)&::endl_abi_cxx11_);
  poVar4 = std::operator<<(poVar4," protected:");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_((string *)&returnfield,(t_generator *)this);
  poVar4 = std::operator<<(poVar4,(string *)&returnfield);
  poVar4 = std::operator<<(poVar4,"std::unique_ptr<");
  poVar4 = std::operator<<(poVar4,(string *)&svcname);
  poVar4 = std::operator<<(poVar4,"Handler> syncHandler_;");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&returnfield);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -1;
  poVar4 = std::operator<<((ostream *)&f_skeleton,"};");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_((string *)&returnfield,(t_generator *)this);
  poVar4 = std::operator<<((ostream *)&f_skeleton,(string *)&returnfield);
  poVar4 = std::operator<<(poVar4,"int main(int argc, char **argv) {");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&returnfield);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  t_generator::indent_abi_cxx11_((string *)&returnfield,(t_generator *)this);
  poVar4 = std::operator<<((ostream *)&f_skeleton,(string *)&returnfield);
  poVar4 = std::operator<<(poVar4,"int port = 9090;");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&target,(t_generator *)this);
  poVar4 = std::operator<<(poVar4,(string *)&target);
  poVar4 = std::operator<<(poVar4,"::std::shared_ptr<");
  poVar4 = std::operator<<(poVar4,(string *)&svcname);
  poVar4 = std::operator<<(poVar4,"AsyncHandler> handler(new ");
  poVar4 = std::operator<<(poVar4,(string *)&svcname);
  poVar4 = std::operator<<(poVar4,"AsyncHandler());");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_518,(t_generator *)this);
  poVar4 = std::operator<<(poVar4,(string *)&local_518);
  poVar4 = std::operator<<(poVar4,"::std::shared_ptr<");
  poVar4 = std::operator<<(poVar4,(string *)&svcname);
  poVar4 = std::operator<<(poVar4,"AsyncProcessor> processor(new ");
  poVar4 = std::operator<<(poVar4,(string *)&svcname);
  poVar4 = std::operator<<(poVar4,"AsyncProcessor(handler));");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_4b8,(t_generator *)this);
  poVar4 = std::operator<<(poVar4,(string *)&local_4b8);
  poVar4 = std::operator<<(poVar4,
                           "::std::shared_ptr<TProtocolFactory> protocolFactory(new TBinaryProtocolFactory());"
                          );
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_3d0,(t_generator *)this);
  poVar4 = std::operator<<(poVar4,(string *)&local_3d0);
  poVar4 = std::operator<<(poVar4,
                           "::std::shared_ptr<TAsyncProtocolProcessor> protocolProcessor(new TAsyncProtocolProcessor(processor, protocolFactory));"
                          );
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_370,(t_generator *)this);
  poVar4 = std::operator<<(poVar4,(string *)&local_370);
  poVar4 = std::operator<<(poVar4,"TEvhttpServer server(protocolProcessor, port);");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_390,(t_generator *)this);
  poVar4 = std::operator<<(poVar4,(string *)&local_390);
  poVar4 = std::operator<<(poVar4,"server.serve();");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_350,(t_generator *)this);
  poVar4 = std::operator<<(poVar4,(string *)&local_350);
  poVar4 = std::operator<<(poVar4,"return 0;");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_350);
  std::__cxx11::string::~string((string *)&local_390);
  std::__cxx11::string::~string((string *)&local_370);
  std::__cxx11::string::~string((string *)&local_3d0);
  std::__cxx11::string::~string((string *)&local_4b8);
  std::__cxx11::string::~string((string *)&local_518);
  std::__cxx11::string::~string((string *)&target);
  std::__cxx11::string::~string((string *)&returnfield);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -1;
  poVar4 = std::operator<<((ostream *)&f_skeleton,"}");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::_Vector_base<t_function_*,_std::allocator<t_function_*>_>::~_Vector_base
            (&functions.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>);
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::
  ~template_ofstream_with_content_based_conditional_update(&f_skeleton);
  std::__cxx11::string::~string((string *)&ns);
  std::__cxx11::string::~string((string *)&f_skeleton_name);
  std::__cxx11::string::~string((string *)&svcname);
  return;
}

Assistant:

void t_cpp_generator::generate_service_async_skeleton(t_service* tservice) {
  string svcname = tservice->get_name();

  // Service implementation file includes
  string f_skeleton_name = get_out_dir() + svcname + "_async_server.skeleton.cpp";

  string ns = namespace_prefix(tservice->get_program()->get_namespace("cpp"));

  ofstream_with_content_based_conditional_update f_skeleton;
  f_skeleton.open(f_skeleton_name.c_str());
  f_skeleton << "// This autogenerated skeleton file illustrates one way to adapt a synchronous"
             << endl << "// interface into an asynchronous interface. You should copy it to another"
             << endl
             << "// filename to avoid overwriting it and rewrite as asynchronous any functions"
             << endl << "// that would otherwise introduce unwanted latency." << endl << endl
             << "#include \"" << get_include_prefix(*get_program()) << svcname << ".h\"" << endl
             << "#include <thrift/protocol/TBinaryProtocol.h>" << endl
             << "#include <thrift/async/TAsyncProtocolProcessor.h>" << endl
             << "#include <thrift/async/TEvhttpServer.h>" << endl
             << "#include <event.h>" << endl
             << "#include <evhttp.h>" << endl << endl
             << "using namespace ::apache::thrift;" << endl
             << "using namespace ::apache::thrift::protocol;" << endl
             << "using namespace ::apache::thrift::transport;" << endl
             << "using namespace ::apache::thrift::async;" << endl << endl;

  // the following code would not compile:
  // using namespace ;
  // using namespace ::;
  if ((!ns.empty()) && (ns.compare(" ::") != 0)) {
    f_skeleton << "using namespace " << string(ns, 0, ns.size() - 2) << ";" << endl << endl;
  }

  f_skeleton << "class " << svcname << "Handler : virtual public " << svcname << "If {" << endl
             << " public:" << endl;
  indent_up();
  f_skeleton << indent() << svcname << "Handler() {" << endl << indent()
             << "  // Your initialization goes here" << endl << indent() << "}" << endl << endl;

  vector<t_function*> functions = tservice->get_functions();
  vector<t_function*>::iterator f_iter;
  for (f_iter = functions.begin(); f_iter != functions.end(); ++f_iter) {
    generate_java_doc(f_skeleton, *f_iter);
    f_skeleton << indent() << function_signature(*f_iter, "") << " {" << endl << indent()
               << "  // Your implementation goes here" << endl << indent() << "  printf(\""
               << (*f_iter)->get_name() << "\\n\");" << endl << indent() << "}" << endl << endl;
  }

  indent_down();
  f_skeleton << "};" << endl << endl;

  f_skeleton << "class " << svcname << "AsyncHandler : "
             << "public " << svcname << "CobSvIf {" << endl << " public:" << endl;
  indent_up();
  f_skeleton << indent() << svcname << "AsyncHandler() {" << endl << indent()
             << "  syncHandler_ = std::unique_ptr<" << svcname << "Handler>(new " << svcname
             << "Handler);" << endl << indent() << "  // Your initialization goes here" << endl
             << indent() << "}" << endl;
  f_skeleton << indent() << "virtual ~" << service_name_ << "AsyncHandler();" << endl;

  for (f_iter = functions.begin(); f_iter != functions.end(); ++f_iter) {
    f_skeleton << endl << indent() << function_signature(*f_iter, "CobSv", "", true) << " {"
               << endl;
    indent_up();

    t_type* returntype = (*f_iter)->get_returntype();
    t_field returnfield(returntype, "_return");

    string target = returntype->is_void() ? "" : "_return";
    if (!returntype->is_void()) {
      f_skeleton << indent() << declare_field(&returnfield, true) << endl;
    }
    generate_function_call(f_skeleton, *f_iter, target, "syncHandler_", "");
    f_skeleton << indent() << "return cob(" << target << ");" << endl;

    scope_down(f_skeleton);
  }
  f_skeleton << endl << " protected:" << endl << indent() << "std::unique_ptr<" << svcname
             << "Handler> syncHandler_;" << endl;
  indent_down();
  f_skeleton << "};" << endl << endl;

  f_skeleton << indent() << "int main(int argc, char **argv) {" << endl;
  indent_up();
  f_skeleton
      << indent() << "int port = 9090;" << endl << indent() << "::std::shared_ptr<" << svcname
      << "AsyncHandler> handler(new " << svcname << "AsyncHandler());" << endl << indent()
      << "::std::shared_ptr<" << svcname << "AsyncProcessor> processor(new " << svcname << "AsyncProcessor(handler));" << endl
      << indent() << "::std::shared_ptr<TProtocolFactory> protocolFactory(new TBinaryProtocolFactory());"
      << endl
      << indent() << "::std::shared_ptr<TAsyncProtocolProcessor> protocolProcessor(new TAsyncProtocolProcessor(processor, protocolFactory));"
      << endl << endl << indent()
      << "TEvhttpServer server(protocolProcessor, port);"
      << endl << indent() << "server.serve();" << endl << indent() << "return 0;" << endl;
  indent_down();
  f_skeleton << "}" << endl << endl;
}